

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

int __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  string_view_type sVar1;
  string_view_type sVar2;
  type tVar3;
  error_code eVar4;
  uint local_4c;
  string local_48;
  to_integer_result<int,_char> local_28;
  
  do {
    switch(*(byte *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_> &
           0xf) {
    case 1:
      return (uint)*(byte *)((long)&(((pointer)this)->
                                    super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                                    extra_ + 2);
    case 2:
    case 3:
      return *(int *)&(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>
                      ).field_0x8;
    default:
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Not an integer","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_48);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    case 5:
      return (int)*(double *)
                   &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                    field_0x8;
    case 6:
      return (uint)*(ushort *)
                    ((long)&(((pointer)this)->
                            super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 2
                    );
    case 7:
    case 0xf:
      sVar1 = as_string_view(this);
      sVar2 = as_string_view(this);
      tVar3 = detail::to_integer<int,char>(sVar1._M_str,sVar2._M_len,(int *)&local_4c);
      local_28.ptr = tVar3.ptr;
      local_28.ec = tVar3.ec;
      if (local_28.ec == success) {
        return local_4c;
      }
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      eVar4 = detail::to_integer_result<int,_char>::error_code(&local_28);
      (**(code **)(*(long *)eVar4._M_cat + 0x20))(&local_48,eVar4._M_cat,eVar4._M_value);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&local_48);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    case 8:
    case 9:
      this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
             byte_str_).ptr_;
    }
  } while( true );
}

Assistant:

IntegerType as_integer() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    IntegerType val;
                    auto result = jsoncons::detail::to_integer(as_string_view().data(), as_string_view().length(), val);
                    if (!result)
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>(result.error_code().message()));
                    }
                    return val;
                }
                case json_storage_kind::half_float:
                    return static_cast<IntegerType>(cast<half_storage>().value());
                case json_storage_kind::float64:
                    return static_cast<IntegerType>(cast<double_storage>().value());
                case json_storage_kind::int64:
                    return static_cast<IntegerType>(cast<int64_storage>().value());
                case json_storage_kind::uint64:
                    return static_cast<IntegerType>(cast<uint64_storage>().value());
                case json_storage_kind::boolean:
                    return static_cast<IntegerType>(cast<bool_storage>().value() ? 1 : 0);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template as_integer<IntegerType>();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template as_integer<IntegerType>();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an integer"));
            }
        }